

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

NodeInputData *
dxil_spv::Converter::get_node_input
          (NodeInputData *__return_storage_ptr__,LLVMBCParser *parser,char *entry)

{
  Module *module;
  MDNode *meta;
  MDNode *entry_point_meta;
  char *entry_local;
  LLVMBCParser *parser_local;
  
  module = LLVMBCParser::get_module(parser);
  meta = get_entry_point_meta(module,entry);
  if (meta == (MDNode *)0x0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::basic_string(&__return_storage_ptr__->node_id);
    __return_storage_ptr__->payload_stride = 0;
    __return_storage_ptr__->launch_type = Invalid;
    __return_storage_ptr__->node_array_index = 0;
    (__return_storage_ptr__->grid_buffer).offset = 0;
    (__return_storage_ptr__->grid_buffer).component_type = Invalid;
    (__return_storage_ptr__->grid_buffer).count = 0;
    memset(__return_storage_ptr__->broadcast_grid,0,0xc);
    memset(__return_storage_ptr__->thread_group_size_spec_id,0,0xc);
    memset(__return_storage_ptr__->max_broadcast_grid_spec_id,0,0xc);
    __return_storage_ptr__->recursion_factor = 0;
    __return_storage_ptr__->coalesce_factor = 0;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::basic_string(&__return_storage_ptr__->node_share_input_id);
    __return_storage_ptr__->node_share_input_array_index = 0;
    __return_storage_ptr__->local_root_arguments_table_index = 0;
    __return_storage_ptr__->is_indirect_bda_stride_program_entry_spec_id = 0;
    __return_storage_ptr__->is_entry_point_spec_id = 0;
    __return_storage_ptr__->dispatch_grid_is_upper_bound_spec_id = 0;
    __return_storage_ptr__->is_static_broadcast_node_spec_id = 0;
    __return_storage_ptr__->dispatch_grid_is_upper_bound = false;
    __return_storage_ptr__->node_track_rw_input_sharing = false;
    __return_storage_ptr__->is_program_entry = false;
  }
  else {
    Impl::get_node_input(__return_storage_ptr__,meta);
  }
  return __return_storage_ptr__;
}

Assistant:

NodeInputData Converter::get_node_input(const LLVMBCParser &parser, const char *entry)
{
	auto *entry_point_meta = get_entry_point_meta(parser.get_module(), entry);
	if (!entry_point_meta)
		return {};
	return Impl::get_node_input(entry_point_meta);
}